

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O3

int __thiscall KParser::_adv_expr(KParser *this,int begin,BlockInfo *bi)

{
  pointer pcVar1;
  int iVar2;
  undefined1 local_68 [32];
  _Alloc_hider local_48;
  char local_38 [16];
  
  pcVar1 = (bi->sLabel)._M_dataplus._M_p;
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar1,pcVar1 + (bi->sLabel)._M_string_length);
  pcVar1 = (bi->eLabel)._M_dataplus._M_p;
  local_48._M_p = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (bi->eLabel)._M_string_length);
  iVar2 = _or_expr(this,begin,(BlockInfo *)local_68);
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_);
  }
  return iVar2;
}

Assistant:

int KParser::_adv_expr(int begin,  BlockInfo bi) {
    return _or_expr(begin, bi);
}